

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCNSeq.cpp
# Opt level: O0

void __thiscall OpenMD::GCNSeq::doFrame(GCNSeq *this,int istep)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  size_type sVar4;
  uint *puVar5;
  reference pvVar6;
  reference pvVar7;
  ostream *poVar8;
  SelectionManager *this_00;
  SelectionManager *pSVar9;
  int in_ESI;
  long in_RDI;
  double dVar10;
  undefined1 auVar11 [16];
  uint n;
  uint i_1;
  vector<double,_std::allocator<double>_> histo;
  uint i;
  int commonCount;
  RealType distance;
  Vector3d diff;
  Vector3d pos2;
  Vector3d pos1;
  RealType gcn;
  uint whichBin;
  uint tempIndex;
  uint mapIndex2;
  uint mapIndex1;
  int iterator2;
  int iterator1;
  StuntDouble *sd2;
  StuntDouble *sd1;
  vector<int,_std::allocator<int>_> globalToLocal;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  listNN;
  SelectionManager common;
  SelectionManager *in_stack_fffffffffffffbe8;
  SelectionManager *in_stack_fffffffffffffbf0;
  StuntDouble *in_stack_fffffffffffffbf8;
  SelectionManager *in_stack_fffffffffffffc00;
  size_type in_stack_fffffffffffffc08;
  SelectionManager *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc20;
  Vector3d *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  uint local_2e8;
  uint local_2e4;
  vector<double,_std::allocator<double>_> local_288;
  uint local_26c;
  undefined4 local_268;
  int local_264;
  double local_198;
  SimInfo *in_stack_fffffffffffffe98;
  SelectionManager *in_stack_fffffffffffffea0;
  double local_138;
  uint local_128;
  uint local_124;
  StuntDouble *local_118;
  StuntDouble *local_110;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_f0 [9];
  int local_c;
  
  local_c = in_ESI;
  SelectionManager::SelectionManager(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x1379d4);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1379e1);
  Vector3<double>::Vector3((Vector3<double> *)0x137a26);
  Vector3<double>::Vector3((Vector3<double> *)0x137a35);
  Vector3<double>::Vector3((Vector3<double> *)0x137a44);
  iVar1 = SelectionManager::getSelectionCount((SelectionManager *)0x137a57);
  *(int *)(in_RDI + 0xd68) = iVar1;
  iVar1 = SelectionManager::getSelectionCount((SelectionManager *)0x137a81);
  *(int *)(in_RDI + 0xd6c) = iVar1;
  operator|((SelectionManager *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
            in_stack_fffffffffffffc10);
  SelectionManager::operator=(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  SelectionManager::~SelectionManager(in_stack_fffffffffffffbf0);
  local_264 = SelectionManager::getSelectionCount((SelectionManager *)0x137afb);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x137b1f);
  SimInfo::getNGlobalAtoms(*(SimInfo **)(in_RDI + 8));
  SimInfo::getNGlobalRigidBodies(*(SimInfo **)(in_RDI + 8));
  local_268 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc20,
             CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
             (value_type_conflict1 *)in_stack_fffffffffffffc10);
  for (local_26c = 0; uVar3 = (ulong)local_26c,
      sVar4 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size(local_f0), uVar3 < sVar4; local_26c = local_26c + 1) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *)in_stack_fffffffffffffbf0,(size_type)in_stack_fffffffffffffbe8);
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x137bec);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *)0x137c2d);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x137c59);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffc20,CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18)
             ,(value_type_conflict *)in_stack_fffffffffffffc10);
  local_124 = 0;
  local_110 = SelectionManager::beginSelected
                        (in_stack_fffffffffffffc00,(int *)in_stack_fffffffffffffbf8);
  while (local_110 != (StuntDouble *)0x0) {
    StuntDouble::getGlobalIndex(local_110);
    puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::at
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                                (size_type)in_stack_fffffffffffffbe8);
    *puVar5 = local_124;
    StuntDouble::getPos(in_stack_fffffffffffffbf8);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffbf0,
               (Vector3<double> *)in_stack_fffffffffffffbe8);
    local_128 = 0;
    local_118 = SelectionManager::beginSelected
                          (in_stack_fffffffffffffc00,(int *)in_stack_fffffffffffffbf8);
    while (local_118 != (StuntDouble *)0x0) {
      if (local_124 < local_128) {
        StuntDouble::getPos(in_stack_fffffffffffffbf8);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffbf0,
                   (Vector3<double> *)in_stack_fffffffffffffbe8);
        OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffbf8,
                          (Vector<double,_3U> *)in_stack_fffffffffffffbf0);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffbf8,
                   (Vector<double,_3U> *)in_stack_fffffffffffffbf0);
        if ((*(byte *)(in_RDI + 0xd54) & 1) != 0) {
          Snapshot::wrapVector
                    ((Snapshot *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     in_stack_fffffffffffffc68);
        }
        local_198 = Vector<double,_3U>::length((Vector<double,_3U> *)0x137e7a);
        if (local_198 < *(double *)(in_RDI + 0xd48)) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)in_stack_fffffffffffffbf0,(size_type)in_stack_fffffffffffffbe8);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                     (value_type_conflict1 *)in_stack_fffffffffffffbe8);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)in_stack_fffffffffffffbf0,(size_type)in_stack_fffffffffffffbe8);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                     (value_type_conflict1 *)in_stack_fffffffffffffbe8);
        }
      }
      local_128 = local_128 + 1;
      local_118 = SelectionManager::nextSelected
                            (in_stack_fffffffffffffc00,(int *)in_stack_fffffffffffffbf8);
    }
    local_124 = local_124 + 1;
    local_110 = SelectionManager::nextSelected
                          (in_stack_fffffffffffffc00,(int *)in_stack_fffffffffffffbf8);
  }
  local_110 = SelectionManager::beginSelected
                        (in_stack_fffffffffffffc00,(int *)in_stack_fffffffffffffbf8);
  while (local_110 != (StuntDouble *)0x0) {
    StuntDouble::getGlobalIndex(local_110);
    std::vector<int,_std::allocator<int>_>::at
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
               (size_type)in_stack_fffffffffffffbe8);
    local_138 = 0.0;
    local_2e4 = 0;
    while( true ) {
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)in_stack_fffffffffffffbf0,(size_type)in_stack_fffffffffffffbe8);
      sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar6);
      if (sVar4 <= local_2e4) break;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_fffffffffffffbf0,(size_type)in_stack_fffffffffffffbe8);
      std::vector<int,_std::allocator<int>_>::at
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                 (size_type)in_stack_fffffffffffffbe8);
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)in_stack_fffffffffffffbf0,(size_type)in_stack_fffffffffffffbe8);
      sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar6);
      auVar11._8_4_ = (int)(sVar4 >> 0x20);
      auVar11._0_8_ = sVar4;
      auVar11._12_4_ = 0x45300000;
      local_138 = (auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0) + local_138;
      local_2e4 = local_2e4 + 1;
    }
    local_138 = local_138 / (double)*(int *)(in_RDI + 0xd58);
    uVar2 = (uint)(local_138 / *(double *)(in_RDI + 0xd60));
    sVar4 = std::vector<double,_std::allocator<double>_>::size(&local_288);
    if (uVar2 < sVar4) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_288,(ulong)uVar2);
      *pvVar7 = *pvVar7 + 1.0;
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cerr,"In frame ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_c);
      poVar8 = std::operator<<(poVar8,", object ");
      iVar1 = StuntDouble::getGlobalIndex(local_110);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar1);
      poVar8 = std::operator<<(poVar8," has GCN value = ");
      in_stack_fffffffffffffc00 = (SelectionManager *)std::ostream::operator<<(poVar8,local_138);
      std::operator<<((ostream *)in_stack_fffffffffffffc00,"\n");
    }
    in_stack_fffffffffffffbf8 =
         SelectionManager::nextSelected(in_stack_fffffffffffffc00,(int *)in_stack_fffffffffffffbf8);
    local_110 = in_stack_fffffffffffffbf8;
  }
  local_2e8 = 0;
  while( true ) {
    this_00 = (SelectionManager *)(ulong)local_2e8;
    pSVar9 = (SelectionManager *)std::vector<double,_std::allocator<double>_>::size(&local_288);
    if (pSVar9 <= this_00) break;
    if (*(int *)(in_RDI + 0xd68) < 1) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_288,(ulong)local_2e8)
      ;
      *pvVar7 = 0.0;
    }
    else {
      dVar10 = (double)*(int *)(in_RDI + 0xd68);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_288,(ulong)local_2e8)
      ;
      *pvVar7 = *pvVar7 / dVar10;
    }
    local_2e8 = local_2e8 + 1;
  }
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc00,
             (value_type_conflict1 *)in_stack_fffffffffffffbf8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)in_stack_fffffffffffffc00,(value_type *)in_stack_fffffffffffffbf8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc00);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc00);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_fffffffffffffc00);
  SelectionManager::~SelectionManager(this_00);
  return;
}

Assistant:

void GCNSeq::doFrame(int istep) {
    SelectionManager common(info_);

    std::vector<std::vector<int>> listNN;
    std::vector<int> globalToLocal;

    StuntDouble* sd1;
    StuntDouble* sd2;

    int iterator1;
    int iterator2;
    unsigned int mapIndex1(0);
    unsigned int mapIndex2(0);
    unsigned int tempIndex(0);
    unsigned int whichBin(0);
    RealType gcn(0.0);
    Vector3d pos1;
    Vector3d pos2;
    Vector3d diff;
    RealType distance;

    // First have to calculate lists of nearest neighbors (listNN_):

    selectionCount1_ = seleMan1_.getSelectionCount();
    selectionCount2_ = seleMan2_.getSelectionCount();

    // We need a common selection set:
    common          = seleMan1_ | seleMan2_;
    int commonCount = common.getSelectionCount();

    globalToLocal.clear();
    globalToLocal.resize(
        info_->getNGlobalAtoms() + info_->getNGlobalRigidBodies(), -1);
    for (unsigned int i = 0; i < listNN.size(); i++)
      listNN.at(i).clear();
    listNN.clear();
    listNN.resize(commonCount);
    std::vector<RealType> histo;
    histo.resize(bins_, 0.0);

    mapIndex1 = 0;
    for (sd1 = common.beginSelected(iterator1); sd1 != NULL;
         sd1 = common.nextSelected(iterator1)) {
      globalToLocal.at(sd1->getGlobalIndex()) = mapIndex1;

      pos1 = sd1->getPos();

      mapIndex2 = 0;
      for (sd2 = common.beginSelected(iterator2); sd2 != NULL;
           sd2 = common.nextSelected(iterator2)) {
        if (mapIndex1 < mapIndex2) {
          pos2 = sd2->getPos();
          diff = pos2 - pos1;
          if (usePBC_) currentSnapshot_->wrapVector(diff);
          distance = diff.length();
          if (distance < rCut_) {
            listNN.at(mapIndex1).push_back(mapIndex2);
            listNN.at(mapIndex2).push_back(mapIndex1);
          }
        }
        mapIndex2++;
      }
      mapIndex1++;
    }

    // Fill up the histogram with gcn values
    for (sd1 = seleMan1_.beginSelected(iterator1); sd1 != NULL;
         sd1 = seleMan1_.nextSelected(iterator1)) {
      mapIndex1 = globalToLocal.at(sd1->getGlobalIndex());
      gcn       = 0.0;
      for (unsigned int i = 0; i < listNN.at(mapIndex1).size(); i++) {
        // tempIndex is the index of one of i's nearest neighbors
        tempIndex = listNN.at(mapIndex1).at(i);
        gcn += listNN.at(tempIndex).size();
      }

      gcn      = gcn / nnMax_;
      whichBin = int(gcn / delta_);
      if (whichBin < histo.size()) {
        histo[whichBin] += 1;
      } else {
        cerr << "In frame " << istep << ", object " << sd1->getGlobalIndex()
             << " has GCN value = " << gcn << "\n";
      }
    }

    for (unsigned int n = 0; n < histo.size(); n++) {
      if (selectionCount1_ > 0)
        histo[n] /= RealType(selectionCount1_);
      else
        histo[n] = 0.0;
    }

    count_.push_back(selectionCount1_);
    histogram_.push_back(histo);
  }